

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ray_tracing.cpp
# Opt level: O2

bool dxil_spv::emit_allocate_ray_query(Impl *impl,CallInst *inst)

{
  SPIRVModule *this;
  Id IVar1;
  Builder *pBVar2;
  mapped_type *pmVar3;
  CallInst *local_20;
  
  pBVar2 = Converter::Impl::builder(impl);
  this = impl->spirv_module;
  IVar1 = spv::Builder::makeRayQueryType(pBVar2);
  IVar1 = SPIRVModule::create_variable(this,StorageClassPrivate,IVar1,(char *)0x0);
  Converter::Impl::rewrite_value(impl,(Value *)inst,IVar1);
  local_20 = inst;
  pmVar3 = std::__detail::
           _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_spv::StorageClass>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_spv::StorageClass>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_spv::StorageClass>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_spv::StorageClass>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&impl->handle_to_storage_class,(key_type *)&local_20);
  *pmVar3 = StorageClassPrivate;
  pBVar2 = Converter::Impl::builder(impl);
  spv::Builder::addExtension(pBVar2,"SPV_KHR_ray_query");
  spv::Builder::addCapability(pBVar2,CapabilityRayQueryKHR);
  spv::Builder::addCapability(pBVar2,CapabilityRayTraversalPrimitiveCullingKHR);
  if ((impl->options).opacity_micromap_enabled == true) {
    spv::Builder::addExtension(pBVar2,"SPV_EXT_opacity_micromap");
    spv::Builder::addCapability(pBVar2,CapabilityRayTracingOpacityMicromapEXT);
  }
  return true;
}

Assistant:

bool emit_allocate_ray_query(Converter::Impl &impl, const llvm::CallInst *inst)
{
	// TODO: It seems like we can use full variable pointers with RayQuery in DXIL.
	// To implement this, we will need some kind of global "bank" of ray query objects,
	// and allocateRayQuery could assign indices into that global array.
	// Until we actually see this happen in practice, we can just allocate RayQuery objects like this.
	// The return type of allocateRayQuery appears to be i32, so this might be how it's intended to be done ...
	auto &builder = impl.builder();
	spv::Id var_id = impl.spirv_module.create_variable(spv::StorageClassPrivate, builder.makeRayQueryType());
	impl.rewrite_value(inst, var_id);
	impl.handle_to_storage_class[inst] = spv::StorageClassPrivate;
	emit_ray_query_capabilities(impl);
	return true;
}